

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  short *psVar1;
  short *psVar2;
  short *psVar3;
  uint uVar4;
  char *pcVar5;
  short *psVar6;
  undefined8 *in_RCX;
  long in_RSI;
  Mat *in_RDI;
  int n_12;
  int n_11;
  int n_10;
  int o1 [2];
  int o0 [2];
  int d3_1 [2];
  int d2_1 [2];
  int d1_1 [2];
  int d0_1 [2];
  int w1_1 [4];
  int w0_1 [4];
  int s3 [4];
  int s2 [4];
  int s1 [4];
  int s0 [4];
  int *out_tile;
  int i_3;
  int *outRow1;
  int *outRow0;
  int j_1;
  Mat out;
  Mat out_tm;
  int p_2;
  int nRowBlocks_2;
  int nColBlocks_2;
  int h_tm_2;
  int w_tm_2;
  Mat top_blob_bordered;
  int n_9;
  int n_8;
  short *k0_3;
  short *r0_4;
  int n_7;
  short *k3_2;
  short *k2_2;
  short *k1_2;
  short *k0_2;
  short *r3_2;
  short *r2_2;
  short *r1_2;
  short *r0_3;
  int q_2;
  int sum0_1 [16];
  int *output0_tm_1;
  int i_2;
  Mat kernel0_tm_1;
  Mat out0_tm_1;
  int p_1;
  int n_6;
  int n_5;
  short *k3_1;
  short *k2_1;
  short *k1_1;
  short *k0_1;
  short *r0_2;
  int n_4;
  short *k3;
  short *k2;
  short *k1;
  short *k0;
  short *r3_1;
  short *r2_1;
  short *r1_1;
  short *r0_1;
  int q_1;
  int sum3 [16];
  int sum2 [16];
  int sum1 [16];
  int sum0 [16];
  int *output3_tm;
  int *output2_tm;
  int *output1_tm;
  int *output0_tm;
  int i_1;
  Mat kernel3_tm;
  Mat kernel2_tm;
  Mat kernel1_tm;
  Mat kernel0_tm;
  Mat out3_tm;
  Mat out2_tm;
  Mat out1_tm;
  Mat out0_tm;
  int p;
  int pp;
  int remain_outch_start;
  int nn_outch;
  int tiles_1;
  int nRowBlocks_1;
  int nColBlocks_1;
  int h_tm_1;
  int w_tm_1;
  Mat top_blob_tm;
  int n_3;
  int n_2;
  int n_1;
  int n;
  short t3 [4];
  short t2 [4];
  short t1 [4];
  short t0 [4];
  short w3 [4];
  short w2 [4];
  short w1 [4];
  short w0 [4];
  short d3 [4];
  short d2 [4];
  short d1 [4];
  short d0 [4];
  int i;
  char *r3;
  char *r2;
  char *r1;
  char *r0;
  int j;
  short *out_tm0;
  char *img;
  int q;
  int tiles;
  int nRowBlocks;
  int nColBlocks;
  int h_tm;
  int w_tm;
  Mat bottom_blob_tm;
  Option opt_b;
  Mat bottom_blob_bordered;
  int outch;
  int outh;
  int outw;
  int inch;
  int h;
  int w;
  Mat *m;
  Mat *in_stack_fffffffffffff258;
  undefined8 in_stack_fffffffffffff260;
  int _c;
  undefined8 in_stack_fffffffffffff268;
  Mat *in_stack_fffffffffffff270;
  int local_c44;
  int local_c40;
  int local_c3c;
  int local_c38 [4];
  undefined4 local_c28;
  undefined4 local_c24;
  undefined4 local_c20;
  undefined4 local_c1c;
  undefined4 local_c18;
  undefined4 local_c14;
  int local_c10;
  undefined4 local_c0c;
  int local_c08 [4];
  int local_bf8 [4];
  int aiStack_be8 [4];
  int aiStack_bd8 [4];
  int aiStack_bc8 [4];
  int aiStack_bb8 [6];
  Mat *local_ba0;
  int local_b94;
  int *local_b90;
  int *local_b88;
  int local_b7c;
  Mat local_b78;
  Mat local_b38;
  int local_af4;
  int local_af0;
  int local_aec;
  int local_ae8;
  int local_ae4;
  Mat local_ae0;
  Mat local_aa0;
  int local_a60;
  int local_a5c;
  short *local_a58;
  Mat local_a50;
  short *local_a10;
  int local_a04;
  short *local_a00;
  short *local_9f8;
  short *local_9f0;
  short *local_9e8;
  Mat local_9e0;
  short *local_9a0;
  Mat local_998;
  short *local_958;
  Mat local_950;
  short *local_910;
  Mat local_908;
  short *local_8c8;
  int local_8bc;
  int local_8b8 [18];
  int *local_870;
  int local_864;
  Mat local_860;
  Mat local_820;
  int local_7dc;
  int local_7d8;
  int local_7d4;
  short *local_7d0;
  short *local_7c8;
  short *local_7c0;
  short *local_7b8;
  Mat local_7b0;
  short *local_770;
  int local_764;
  short *local_760;
  short *local_758;
  short *local_750;
  short *local_748;
  Mat local_740;
  short *local_700;
  Mat local_6f8;
  short *local_6b8;
  Mat local_6b0;
  short *local_670;
  Mat local_668;
  short *local_628;
  int local_61c;
  int local_618 [16];
  int local_5d8 [16];
  int local_598 [16];
  int local_558 [18];
  int *local_510;
  int *local_508;
  int *local_500;
  int *local_4f8;
  int local_4ec;
  Mat local_4e8;
  int in_stack_fffffffffffffb68;
  int in_stack_fffffffffffffb6c;
  int in_stack_fffffffffffffb70;
  float in_stack_fffffffffffffb74;
  int in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  int in_stack_fffffffffffffb80;
  int in_stack_fffffffffffffb84;
  Mat *in_stack_fffffffffffffb88;
  Mat *in_stack_fffffffffffffb90;
  int in_stack_fffffffffffffba0;
  Option *in_stack_fffffffffffffba8;
  Mat local_428;
  Mat local_3e8;
  Mat local_3a8;
  Mat local_368;
  Mat local_328;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  uint local_2c8;
  uint local_2c4;
  Mat local_2c0;
  Mat local_280;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  short local_22c [4];
  short local_224 [4];
  short local_21c [4];
  short local_214 [4];
  short local_20c [4];
  short local_204 [4];
  short local_1fc [4];
  short local_1f4 [4];
  short asStack_1ec [4];
  short asStack_1e4 [4];
  short asStack_1dc [4];
  short asStack_1d4 [4];
  int local_1cc;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  int local_1a4;
  Mat local_1a0;
  short *local_160;
  Mat local_158;
  char *local_118;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  uint local_100;
  uint local_fc;
  Mat local_f8;
  undefined1 local_a8 [112];
  int local_38;
  uint local_34;
  uint local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined8 *local_20;
  
  local_24 = in_RDI->w;
  local_28 = in_RDI->h;
  local_2c = in_RDI->c;
  local_30 = *(int *)(in_RSI + 0x2c);
  local_34 = *(int *)(in_RSI + 0x30);
  local_38 = *(int *)(in_RSI + 0x34);
  local_20 = in_RCX;
  Mat::Mat((Mat *)(local_a8 + 0x30),in_RDI);
  local_30 = (local_30 + 1) - ((int)(local_30 + 1) >> 0x1f) & 0xfffffffe;
  local_34 = (local_34 + 1) - ((int)(local_34 + 1) >> 0x1f) & 0xfffffffe;
  local_24 = local_30 + 2;
  local_28 = local_34 + 2;
  local_a8._32_8_ = local_20[4];
  local_a8._0_8_ = *local_20;
  local_a8._16_8_ = local_20[2];
  local_a8._24_8_ = local_20[3];
  local_a8._8_8_ = local_20[2];
  m = (Mat *)local_a8;
  copy_make_border(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88,in_stack_fffffffffffffb84,
                   in_stack_fffffffffffffb80,in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78,
                   in_stack_fffffffffffffba0,in_stack_fffffffffffffb74,in_stack_fffffffffffffba8);
  Mat::Mat(&local_f8);
  local_fc = (local_30 - ((int)local_30 >> 0x1f)) * 2 & 0xfffffffc;
  local_100 = (local_34 - ((int)local_34 >> 0x1f)) * 2 & 0xfffffffc;
  uVar4 = local_100;
  if ((int)local_100 < 0) {
    uVar4 = local_100 + 3;
  }
  local_104 = (int)uVar4 >> 2;
  uVar4 = local_fc;
  if ((int)local_fc < 0) {
    uVar4 = local_fc + 3;
  }
  local_108 = (int)uVar4 >> 2;
  local_10c = local_104 * local_108;
  Mat::create(in_stack_fffffffffffff270,(int)((ulong)in_stack_fffffffffffff268 >> 0x20),
              (int)in_stack_fffffffffffff268,(int)((ulong)in_stack_fffffffffffff260 >> 0x20),
              (size_t)in_stack_fffffffffffff258,(Allocator *)m);
  for (local_110 = 0; local_110 < local_2c; local_110 = local_110 + 1) {
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    pcVar5 = Mat::operator_cast_to_signed_char_(&local_158);
    Mat::~Mat((Mat *)0x155b76);
    local_118 = pcVar5;
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    psVar6 = Mat::operator_cast_to_short_(&local_1a0);
    Mat::~Mat((Mat *)0x155bc8);
    local_160 = psVar6;
    for (local_1a4 = 0; local_1a4 < local_104; local_1a4 = local_1a4 + 1) {
      local_1b0 = local_118 + local_24 * local_1a4 * 2;
      local_1b8 = local_1b0 + local_24;
      local_1c0 = local_1b8 + local_24;
      local_1c8 = local_1b8 + local_24 + local_24;
      for (local_1cc = 0; local_1cc < local_108; local_1cc = local_1cc + 1) {
        for (local_230 = 0; local_230 < 4; local_230 = local_230 + 1) {
          asStack_1d4[local_230] = (short)local_1b0[local_230];
          asStack_1dc[local_230] = (short)local_1b8[local_230];
          asStack_1e4[local_230] = (short)local_1c0[local_230];
          asStack_1ec[local_230] = (short)local_1c8[local_230];
        }
        for (local_234 = 0; local_234 < 4; local_234 = local_234 + 1) {
          local_1f4[local_234] = asStack_1d4[local_234] - asStack_1e4[local_234];
          local_1fc[local_234] = asStack_1dc[local_234] + asStack_1e4[local_234];
          local_204[local_234] = asStack_1e4[local_234] - asStack_1dc[local_234];
          local_20c[local_234] = asStack_1ec[local_234] - asStack_1dc[local_234];
        }
        local_214[0] = local_1f4[0];
        local_21c[0] = local_1f4[1];
        local_224[0] = local_1f4[2];
        local_22c[0] = local_1f4[3];
        local_214[1] = local_1fc[0];
        local_21c[1] = local_1fc[1];
        local_224[1] = local_1fc[2];
        local_22c[1] = local_1fc[3];
        local_214[2] = local_204[0];
        local_21c[2] = local_204[1];
        local_224[2] = local_204[2];
        local_22c[2] = local_204[3];
        local_214[3] = local_20c[0];
        local_21c[3] = local_20c[1];
        local_224[3] = local_20c[2];
        local_22c[3] = local_20c[3];
        for (local_238 = 0; local_238 < 4; local_238 = local_238 + 1) {
          asStack_1d4[local_238] = local_214[local_238] - local_224[local_238];
          asStack_1dc[local_238] = local_21c[local_238] + local_224[local_238];
          asStack_1e4[local_238] = local_224[local_238] - local_21c[local_238];
          asStack_1ec[local_238] = local_22c[local_238] - local_21c[local_238];
        }
        for (local_23c = 0; local_23c < 4; local_23c = local_23c + 1) {
          local_160[local_23c] = asStack_1d4[local_23c];
          local_160[local_23c + 4] = asStack_1dc[local_23c];
          local_160[local_23c + 8] = asStack_1e4[local_23c];
          local_160[local_23c + 0xc] = asStack_1ec[local_23c];
        }
        local_1b0 = local_1b0 + 2;
        local_1b8 = local_1b8 + 2;
        local_1c0 = local_1c0 + 2;
        local_1c8 = local_1c8 + 2;
        local_160 = local_160 + 0x10;
      }
    }
  }
  Mat::Mat(&local_280);
  Mat::operator=(in_stack_fffffffffffff258,m);
  Mat::~Mat((Mat *)0x156288);
  Mat::Mat(&local_2c0);
  local_2c4 = (local_30 - ((int)local_30 >> 0x1f)) * 2 & 0xfffffffc;
  local_2c8 = (local_34 - ((int)local_34 >> 0x1f)) * 2 & 0xfffffffc;
  uVar4 = local_2c8;
  if ((int)local_2c8 < 0) {
    uVar4 = local_2c8 + 3;
  }
  local_2cc = (int)uVar4 >> 2;
  uVar4 = local_2c4;
  if ((int)local_2c4 < 0) {
    uVar4 = local_2c4 + 3;
  }
  local_2d0 = (int)uVar4 >> 2;
  local_2d4 = local_2cc * local_2d0;
  Mat::create(in_stack_fffffffffffff270,(int)((ulong)in_stack_fffffffffffff268 >> 0x20),
              (int)in_stack_fffffffffffff268,(int)((ulong)in_stack_fffffffffffff260 >> 0x20),
              (size_t)in_stack_fffffffffffff258,(Allocator *)m);
  local_2d8 = local_38 >> 2;
  local_2dc = local_2d8 << 2;
  for (local_2e0 = 0; local_2e0 < local_2d8; local_2e0 = local_2e0 + 1) {
    local_2e4 = local_2e0 << 2;
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    for (local_4ec = 0; local_4ec < local_2d4; local_4ec = local_4ec + 1) {
      local_4f8 = Mat::row<int>(&local_328,local_4ec);
      local_500 = Mat::row<int>(&local_368,local_4ec);
      local_508 = Mat::row<int>(&local_3a8,local_4ec);
      local_510 = Mat::row<int>(&local_3e8,local_4ec);
      memset(local_558,0,0x40);
      memset(local_598,0,0x40);
      memset(local_5d8,0,0x40);
      memset(local_618,0,0x40);
      for (local_61c = 0; local_61c + 3 < local_2c; local_61c = local_61c + 4) {
        Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
        psVar6 = Mat::row<short>(&local_668,local_4ec);
        Mat::~Mat((Mat *)0x156637);
        local_628 = psVar6;
        Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
        psVar6 = Mat::row<short>(&local_6b0,local_4ec);
        Mat::~Mat((Mat *)0x156698);
        local_670 = psVar6;
        Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
        psVar6 = Mat::row<short>(&local_6f8,local_4ec);
        Mat::~Mat((Mat *)0x1566fa);
        local_6b8 = psVar6;
        Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
        psVar6 = Mat::row<short>(&local_740,local_4ec);
        Mat::~Mat((Mat *)0x15675c);
        local_700 = psVar6;
        local_748 = Mat::row<short>(&local_428,local_61c);
        local_750 = Mat::row<short>((Mat *)&stack0xfffffffffffffb98,local_61c);
        local_758 = Mat::row<short>((Mat *)&stack0xfffffffffffffb58,local_61c);
        local_760 = Mat::row<short>(&local_4e8,local_61c);
        for (local_764 = 0; psVar3 = local_748, psVar2 = local_750, psVar1 = local_758,
            psVar6 = local_760, local_764 < 0x10; local_764 = local_764 + 1) {
          local_558[local_764] =
               (int)local_628[local_764] * (int)local_748[local_764] + local_558[local_764];
          local_748 = local_748 + 0x10;
          local_558[local_764] =
               (int)local_670[local_764] * (int)local_748[local_764] + local_558[local_764];
          local_748 = psVar3 + 0x20;
          local_558[local_764] =
               (int)local_6b8[local_764] * (int)(psVar3 + 0x20)[local_764] + local_558[local_764];
          local_748 = psVar3 + 0x30;
          local_558[local_764] =
               (int)local_700[local_764] * (int)(psVar3 + 0x30)[local_764] + local_558[local_764];
          local_748 = psVar3;
          local_598[local_764] =
               (int)local_628[local_764] * (int)local_750[local_764] + local_598[local_764];
          local_750 = local_750 + 0x10;
          local_598[local_764] =
               (int)local_670[local_764] * (int)local_750[local_764] + local_598[local_764];
          local_750 = psVar2 + 0x20;
          local_598[local_764] =
               (int)local_6b8[local_764] * (int)(psVar2 + 0x20)[local_764] + local_598[local_764];
          local_750 = psVar2 + 0x30;
          local_598[local_764] =
               (int)local_700[local_764] * (int)(psVar2 + 0x30)[local_764] + local_598[local_764];
          local_750 = psVar2;
          local_5d8[local_764] =
               (int)local_628[local_764] * (int)local_758[local_764] + local_5d8[local_764];
          local_758 = local_758 + 0x10;
          local_5d8[local_764] =
               (int)local_670[local_764] * (int)local_758[local_764] + local_5d8[local_764];
          local_758 = psVar1 + 0x20;
          local_5d8[local_764] =
               (int)local_6b8[local_764] * (int)(psVar1 + 0x20)[local_764] + local_5d8[local_764];
          local_758 = psVar1 + 0x30;
          local_5d8[local_764] =
               (int)local_700[local_764] * (int)(psVar1 + 0x30)[local_764] + local_5d8[local_764];
          local_758 = psVar1;
          local_618[local_764] =
               (int)local_628[local_764] * (int)local_760[local_764] + local_618[local_764];
          local_760 = local_760 + 0x10;
          local_618[local_764] =
               (int)local_670[local_764] * (int)local_760[local_764] + local_618[local_764];
          local_760 = psVar6 + 0x20;
          local_618[local_764] =
               (int)local_6b8[local_764] * (int)(psVar6 + 0x20)[local_764] + local_618[local_764];
          local_760 = psVar6 + 0x30;
          local_618[local_764] =
               (int)local_700[local_764] * (int)(psVar6 + 0x30)[local_764] + local_618[local_764];
          local_760 = psVar6;
        }
      }
      for (; local_61c < local_2c; local_61c = local_61c + 1) {
        Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
        psVar6 = Mat::row<short>(&local_7b0,local_4ec);
        Mat::~Mat((Mat *)0x156f34);
        local_770 = psVar6;
        local_7b8 = Mat::row<short>(&local_428,local_61c);
        local_7c0 = Mat::row<short>((Mat *)&stack0xfffffffffffffb98,local_61c);
        local_7c8 = Mat::row<short>((Mat *)&stack0xfffffffffffffb58,local_61c);
        local_7d0 = Mat::row<short>(&local_4e8,local_61c);
        for (local_7d4 = 0; local_7d4 < 0x10; local_7d4 = local_7d4 + 1) {
          local_558[local_7d4] =
               (int)local_770[local_7d4] * (int)local_7b8[local_7d4] + local_558[local_7d4];
          local_598[local_7d4] =
               (int)local_770[local_7d4] * (int)local_7c0[local_7d4] + local_598[local_7d4];
          local_5d8[local_7d4] =
               (int)local_770[local_7d4] * (int)local_7c8[local_7d4] + local_5d8[local_7d4];
          local_618[local_7d4] =
               (int)local_770[local_7d4] * (int)local_7d0[local_7d4] + local_618[local_7d4];
        }
      }
      for (local_7d8 = 0; local_7d8 < 0x10; local_7d8 = local_7d8 + 1) {
        local_4f8[local_7d8] = local_558[local_7d8];
        local_500[local_7d8] = local_598[local_7d8];
        local_508[local_7d8] = local_5d8[local_7d8];
        local_510[local_7d8] = local_618[local_7d8];
      }
    }
    Mat::~Mat((Mat *)0x157223);
    Mat::~Mat((Mat *)0x157230);
    Mat::~Mat((Mat *)0x15723d);
    Mat::~Mat((Mat *)0x15724a);
    Mat::~Mat((Mat *)0x157257);
    Mat::~Mat((Mat *)0x157264);
    Mat::~Mat((Mat *)0x157271);
    Mat::~Mat((Mat *)0x15727e);
  }
  for (local_7dc = local_2dc; _c = (int)((ulong)in_stack_fffffffffffff260 >> 0x20),
      local_7dc < local_38; local_7dc = local_7dc + 1) {
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    for (local_864 = 0; local_864 < local_2d4; local_864 = local_864 + 1) {
      local_870 = Mat::row<int>(&local_820,local_864);
      memset(local_8b8,0,0x40);
      for (local_8bc = 0; local_8bc + 3 < local_2c; local_8bc = local_8bc + 4) {
        Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
        psVar6 = Mat::row<short>(&local_908,local_864);
        Mat::~Mat((Mat *)0x157424);
        local_8c8 = psVar6;
        Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
        psVar6 = Mat::row<short>(&local_950,local_864);
        Mat::~Mat((Mat *)0x157485);
        local_910 = psVar6;
        Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
        psVar6 = Mat::row<short>(&local_998,local_864);
        Mat::~Mat((Mat *)0x1574de);
        local_958 = psVar6;
        Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
        psVar6 = Mat::row<short>(&local_9e0,local_864);
        Mat::~Mat((Mat *)0x157534);
        local_9a0 = psVar6;
        local_9e8 = Mat::row<short>(&local_860,local_8bc);
        local_9f0 = Mat::row<short>(&local_860,local_8bc + 1);
        local_9f8 = Mat::row<short>(&local_860,local_8bc + 2);
        local_a00 = Mat::row<short>(&local_860,local_8bc + 3);
        for (local_a04 = 0; local_a04 < 0x10; local_a04 = local_a04 + 1) {
          local_8b8[local_a04] =
               (int)local_8c8[local_a04] * (int)local_9e8[local_a04] + local_8b8[local_a04];
          local_8b8[local_a04] =
               (int)local_910[local_a04] * (int)local_9f0[local_a04] + local_8b8[local_a04];
          local_8b8[local_a04] =
               (int)local_958[local_a04] * (int)local_9f8[local_a04] + local_8b8[local_a04];
          local_8b8[local_a04] =
               (int)local_9a0[local_a04] * (int)local_a00[local_a04] + local_8b8[local_a04];
        }
      }
      for (; local_8bc < local_2c; local_8bc = local_8bc + 1) {
        Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
        in_stack_fffffffffffff270 = &local_a50;
        psVar6 = Mat::row<short>(in_stack_fffffffffffff270,local_864);
        Mat::~Mat((Mat *)0x1577cf);
        local_a10 = psVar6;
        local_a58 = Mat::row<short>(&local_860,local_8bc);
        for (local_a5c = 0; local_a5c < 0x10; local_a5c = local_a5c + 1) {
          local_8b8[local_a5c] =
               (int)local_a10[local_a5c] * (int)local_a58[local_a5c] + local_8b8[local_a5c];
        }
      }
      for (local_a60 = 0; local_a60 < 0x10; local_a60 = local_a60 + 1) {
        local_870[local_a60] = local_8b8[local_a60];
      }
    }
    Mat::~Mat((Mat *)0x1578f4);
    Mat::~Mat((Mat *)0x157901);
  }
  Mat::Mat(&local_aa0);
  Mat::operator=(in_stack_fffffffffffff258,m);
  Mat::~Mat((Mat *)0x15795c);
  Mat::Mat(&local_ae0);
  Mat::create(in_stack_fffffffffffff270,(int)((ulong)in_stack_fffffffffffff268 >> 0x20),
              (int)in_stack_fffffffffffff268,_c,(size_t)in_stack_fffffffffffff258,(Allocator *)m);
  local_ae4 = (int)local_30 / 2 << 2;
  local_ae8 = (int)local_34 / 2 << 2;
  local_aec = local_ae8 / 4;
  local_af0 = local_ae4 / 4;
  for (local_af4 = 0; local_af4 < local_38; local_af4 = local_af4 + 1) {
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    Mat::channel(in_stack_fffffffffffff258,(int)((ulong)m >> 0x20));
    for (local_b7c = 0; local_b7c < local_aec; local_b7c = local_b7c + 1) {
      local_b88 = Mat::row<int>(&local_b78,local_b7c * 2);
      local_b90 = Mat::row<int>(&local_b78,local_b7c * 2 + 1);
      for (local_b94 = 0; local_b94 < local_af0; local_b94 = local_b94 + 1) {
        in_stack_fffffffffffff258 =
             (Mat *)Mat::row<int>(&local_b38,local_b7c * local_af0 + local_b94);
        local_ba0 = in_stack_fffffffffffff258;
        for (local_c3c = 0; local_c3c < 4; local_c3c = local_c3c + 1) {
          aiStack_bb8[local_c3c] = *(int *)((long)&local_ba0->data + (long)local_c3c * 4);
          aiStack_bc8[local_c3c] = *(int *)((long)&local_ba0->data + (long)(local_c3c + 4) * 4);
          aiStack_bd8[local_c3c] = *(int *)((long)&local_ba0->data + (long)(local_c3c + 8) * 4);
          aiStack_be8[local_c3c] = *(int *)((long)&local_ba0->data + (long)(local_c3c + 0xc) * 4);
        }
        for (local_c40 = 0; local_c40 < 4; local_c40 = local_c40 + 1) {
          local_bf8[local_c40] =
               aiStack_bb8[local_c40] + aiStack_bc8[local_c40] + aiStack_bd8[local_c40];
          local_c38[(long)local_c40 + 0xc] =
               (aiStack_bc8[local_c40] - aiStack_bd8[local_c40]) + aiStack_be8[local_c40];
        }
        local_c10 = local_bf8[0];
        local_c0c = local_c08[0];
        local_c18 = local_bf8[1];
        local_c14 = local_c08[1];
        local_c20 = local_bf8[2];
        local_c1c = local_c08[2];
        local_c28 = local_bf8[3];
        local_c24 = local_c08[3];
        for (local_c44 = 0; local_c44 < 2; local_c44 = local_c44 + 1) {
          local_c38[(long)local_c44 + 2] =
               local_c38[(long)local_c44 + 10] + local_c38[(long)local_c44 + 8] +
               local_c38[(long)local_c44 + 6];
          local_c38[local_c44] =
               (local_c38[(long)local_c44 + 8] - local_c38[(long)local_c44 + 6]) +
               local_c38[(long)local_c44 + 4];
        }
        *local_b88 = local_c38[2] >> 2;
        local_b88[1] = local_c38[3] >> 2;
        *local_b90 = local_c38[0] >> 2;
        local_b90[1] = local_c38[1] >> 2;
        local_b88 = local_b88 + 2;
        local_b90 = local_b90 + 2;
      }
    }
    Mat::~Mat((Mat *)0x157ee2);
    Mat::~Mat((Mat *)0x157eef);
  }
  copy_cut_border((Mat *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
                  (Mat *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                  (int)in_stack_fffffffffffffb74,in_stack_fffffffffffffb70,in_stack_fffffffffffffb6c
                  ,in_stack_fffffffffffffb68,(Option *)in_stack_fffffffffffffb90);
  Mat::~Mat((Mat *)0x157f69);
  Mat::~Mat((Mat *)0x157f76);
  Mat::~Mat((Mat *)0x157f83);
  Mat::~Mat((Mat *)0x157f90);
  return;
}

Assistant:

static void conv3x3s1_winograd23_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm/4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4*4, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 2;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[4],d1[4],d2[4],d3[4];
                    short w0[4],w1[4],w2[4],w3[4];
                    short t0[4],t1[4],t2[4],t3[4];
                    // load 
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }                                  
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {   
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }                                
                    // transpose d to d_t
                    {
                        t0[0]=w0[0]; t1[0]=w0[1]; t2[0]=w0[2]; t3[0]=w0[3];
                        t0[1]=w1[0]; t1[1]=w1[1]; t2[1]=w1[2]; t3[1]=w1[3];
                        t0[2]=w2[0]; t1[2]=w2[1]; t2[2]=w2[2]; t3[2]=w2[3];
                        t0[3]=w3[0]; t1[3]=w3[1]; t2[3]=w3[2]; t3[3]=w3[3];
                    }
                    // U = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {   
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }                
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n   ] = d0[n];
                        out_tm0[n+ 4] = d1[n];
                        out_tm0[n+ 8] = d2[n];
                        out_tm0[n+12] = d3[n];
                    }                  

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();
    
    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm/4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/4;

        const int tiles = nColBlocks * nRowBlocks; 

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p+1);
            Mat out2_tm = top_blob_tm.channel(p+2);
            Mat out3_tm = top_blob_tm.channel(p+3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p+1);
            const Mat kernel2_tm = kernel_tm.channel(p+2);
            const Mat kernel3_tm = kernel_tm.channel(p+3);

            for (int i=0; i<tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);
                int* output1_tm = out1_tm.row<int>(i);
                int* output2_tm = out2_tm.row<int>(i);
                int* output3_tm = out3_tm.row<int>(i);

                int sum0[16] = {0};
                int sum1[16] = {0};
                int sum2[16] = {0};
                int sum3[16] = {0};

                int q = 0;
                for (; q+3<inch; q+=4)
                {   
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q+1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q+2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q+3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += (int)r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += (int)r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += (int)r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q<inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum1[n] += (int)r0[n] * k1[n];
                        sum2[n] += (int)r0[n] * k2[n];
                        sum3[n] += (int)r0[n] * k3[n];
                    }
                }

                for (int n=0; n<16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i=0; i<tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[16] = {0};

                int q = 0;
                for (; q+3<inch; q+=4)
                {   
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q+1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q+2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q+3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel0_tm.row<short>(q+1);
                    const short* k2 = kernel0_tm.row<short>(q+2);
                    const short* k3 = kernel0_tm.row<short>(q+3);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum0[n] += (int)r1[n] * k1[n];
                        sum0[n] += (int)r2[n] * k2[n];
                        sum0[n] += (int)r3[n] * k3[n];
                    }
                }

                for (; q<inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }             
                }

                for (int n=0; n<16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot    

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // }; 

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm/4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j=0; j<nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j*2);
                int* outRow1 = out.row<int>(j*2+1);

                for(int i=0; i<nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j*nRowBlocks + i);

                    int s0[4],s1[4],s2[4],s3[4];
                    int w0[4],w1[4];
                    int d0[2],d1[2],d2[2],d3[2];
                    int o0[2],o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n+ 4];
                        s2[n] = out_tile[n+ 8];
                        s3[n] = out_tile[n+12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0]; d0[1] = w1[0];
                        d1[0] = w0[1]; d1[1] = w1[1];
                        d2[0] = w0[2]; d2[1] = w1[2];
                        d3[0] = w0[3]; d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n];
                        o1[n] = d1[n] - d2[n] + d3[n];
                    }
                    // save to top blob tm,why right 2,because the G' = G*2
                    outRow0[0] = o0[0] >> 2;
                    outRow0[1] = o0[1] >> 2;
                    outRow1[0] = o1[0] >> 2;
                    outRow1[1] = o1[1] >> 2;

                    outRow0 += 2;
                    outRow1 += 2;           
                }
            }
        }        
    }
    // END transform output 

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}